

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O1

_Bool mi_bitmap_is_claimedx_across
                (mi_bitmap_t bitmap,size_t bitmap_fields,size_t count,mi_bitmap_index_t bitmap_idx,
                _Bool *pany_ones,size_t *already_set)

{
  ulong *puVar1;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  _Bool _Var7;
  size_t post_mask;
  size_t mid_mask;
  size_t pre_mask;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  sVar2 = mi_bitmap_mask_across
                    (count,bitmap_fields,(size_t)&local_38,&local_40,&local_48,already_set);
  puVar1 = bitmap + (count >> 6);
  uVar6 = *puVar1 & local_38;
  _Var7 = uVar6 == local_38;
  if (uVar6 + 1 < 3) {
    uVar5 = *(ulong *)(&DAT_00a7b020 + uVar6 * 8);
    uVar4 = 0x10001 >> ((byte)((int)(uVar6 + 1) << 3) & 0x1f);
  }
  else {
    uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
    uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
    uVar5 = ((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    uVar4 = 1;
  }
  bVar3 = (byte)uVar4;
  for (; puVar1 = puVar1 + 1, sVar2 != 0; sVar2 = sVar2 - 1) {
    uVar6 = *puVar1 & local_40;
    if (uVar6 != local_40) {
      _Var7 = false;
    }
    if (uVar6 == 0xffffffffffffffff) {
      uVar6 = 0x40;
LAB_009487a9:
      uVar5 = uVar5 + uVar6;
      uVar4 = 1;
    }
    else if (uVar6 != 0) {
      if (uVar6 != 1) {
        uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
        uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
        uVar6 = ((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
      }
      goto LAB_009487a9;
    }
    bVar3 = (byte)uVar4;
  }
  if (local_48 != 0) {
    uVar6 = *puVar1 & local_48;
    if (uVar6 != local_48) {
      _Var7 = false;
    }
    if (uVar6 == 0xffffffffffffffff) {
      uVar6 = 0x40;
    }
    else {
      if (uVar6 == 0) goto LAB_00948829;
      if (uVar6 != 1) {
        uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
        uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
        uVar6 = ((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
      }
    }
    uVar5 = uVar5 + uVar6;
    bVar3 = 1;
  }
LAB_00948829:
  if (bitmap_idx != 0) {
    *(byte *)bitmap_idx = bVar3 & 1;
  }
  if (pany_ones != (_Bool *)0x0) {
    *(ulong *)pany_ones = uVar5;
  }
  return _Var7;
}

Assistant:

static bool mi_bitmap_is_claimedx_across(mi_bitmap_t bitmap, size_t bitmap_fields, size_t count, mi_bitmap_index_t bitmap_idx, bool* pany_ones, size_t* already_set) {
  size_t idx = mi_bitmap_index_field(bitmap_idx);
  size_t pre_mask;
  size_t mid_mask;
  size_t post_mask;
  size_t mid_count = mi_bitmap_mask_across(bitmap_idx, bitmap_fields, count, &pre_mask, &mid_mask, &post_mask);
  bool all_ones = true;
  bool any_ones = false;
  size_t one_count = 0;
  mi_bitmap_field_t* field = &bitmap[idx];
  size_t prev = mi_atomic_load_relaxed(field++);
  if ((prev & pre_mask) != pre_mask) all_ones = false;
  if ((prev & pre_mask) != 0) { any_ones = true; one_count += mi_popcount(prev & pre_mask); }
  while (mid_count-- > 0) {
    prev = mi_atomic_load_relaxed(field++);
    if ((prev & mid_mask) != mid_mask) all_ones = false;
    if ((prev & mid_mask) != 0) { any_ones = true; one_count += mi_popcount(prev & mid_mask); }
  }
  if (post_mask!=0) {
    prev = mi_atomic_load_relaxed(field);
    if ((prev & post_mask) != post_mask) all_ones = false;
    if ((prev & post_mask) != 0) { any_ones = true; one_count += mi_popcount(prev & post_mask); }
  }
  if (pany_ones != NULL) { *pany_ones = any_ones; }
  if (already_set != NULL) { *already_set = one_count; }
  mi_assert_internal(all_ones ? one_count == count : one_count < count);
  return all_ones;
}